

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Maj3_ManVarMapPrint(Maj3_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  int (*paiVar7) [32];
  ulong uVar8;
  int Levels [32];
  int Firsts [32];
  uint auStack_138 [32];
  int local_b8 [34];
  
  Maj3_ManFirstAndLevel(p->vLevels,local_b8,(int *)auStack_138,p->nVars,p->nObjs);
  printf("Variable map for problem with %d inputs, %d nodes and %d levels: ",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes,(ulong)(uint)p->vLevels->nSize);
  pVVar1 = p->vLevels;
  printf("Vector has %d entries: {",(ulong)(uint)pVVar1->nSize);
  if (0 < pVVar1->nSize) {
    lVar6 = 0;
    do {
      printf(" %d",(ulong)(uint)pVVar1->pArray[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar1->nSize);
  }
  puts(" }");
  printf("    ");
  printf("      ");
  if (0 < p->nObjs) {
    uVar5 = 0;
    do {
      printf("%3d  ",uVar5);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < p->nObjs);
  }
  putchar(10);
  iVar2 = p->nObjs;
  if (p->nVars < iVar2) {
    paiVar7 = p->VarMarks + ((long)iVar2 - 1);
    uVar5 = (long)iVar2;
    do {
      uVar8 = uVar5 - 1;
      printf(" %2d ",uVar8 & 0xffffffff);
      printf(" %2d   ",(ulong)auStack_138[uVar5 - 1]);
      if (0 < p->nObjs) {
        lVar6 = 0;
        do {
          uVar4 = (*paiVar7)[lVar6];
          if (uVar4 == 1) {
            __format = "  +  ";
LAB_005b2fe4:
            printf(__format);
          }
          else {
            if (uVar4 == 0xffffffff) {
              __format = "  .  ";
              goto LAB_005b2fe4;
            }
            iVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,uVar4);
            uVar3 = 0x2b;
            if (iVar2 == 0) {
              uVar3 = 0x20;
            }
            printf("%3d%c ",(ulong)uVar4,uVar3);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nObjs);
      }
      putchar(10);
      paiVar7 = paiVar7 + -1;
      uVar5 = uVar8;
    } while ((long)p->nVars < (long)uVar8);
  }
  return;
}

Assistant:

void Maj3_ManVarMapPrint( Maj3_Man_t * p )
{
    int i, k, Firsts[MAJ3_OBJS], Levels[MAJ3_OBJS];
    Maj3_ManFirstAndLevel( p->vLevels, Firsts, Levels, p->nVars, p->nObjs );
    // print
    printf( "Variable map for problem with %d inputs, %d nodes and %d levels: ", p->nVars, p->nNodes, Vec_IntSize(p->vLevels) );
    Vec_IntPrint( p->vLevels );
    printf( "    " );
    printf( "      " );
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d  ", i );
    printf( "\n" );
    for ( i = p->nObjs-1; i >= p->nVars; i-- )
    {
        printf( " %2d ", i );
        printf( " %2d   ", Levels[i] );
        for ( k = 0; k < p->nObjs; k++ )
            if ( p->VarMarks[i][k] == -1 )
                printf( "  .  " );
            else if ( p->VarMarks[i][k] == 1 )
                printf( "  +  " );
            else 
                printf( "%3d%c ", p->VarMarks[i][k], bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][k]) ? '+' : ' ' );
        printf( "\n" );
    }
}